

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bighexdump.cpp
# Opt level: O3

string * dumpstrings_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  ulong uVar1;
  byte *args;
  byte bVar2;
  bool bVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  char *__s;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  string escapecode;
  string escaped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string *local_90;
  size_t local_88;
  uint8_t *local_80;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  size_t *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = local_68;
  local_90 = __return_storage_ptr__;
  local_80 = buf;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\n\r\t","");
  if (len == 0) {
    sVar11 = 0;
  }
  else {
    bVar3 = false;
    uVar10 = 0;
    uVar6 = 0;
    local_98 = &__return_storage_ptr__->field_2;
    local_88 = len;
    local_58 = usedlen;
    do {
      plVar4 = local_78;
      args = local_80 + uVar6;
      bVar2 = local_80[uVar6];
      if (local_70 == 0) {
LAB_00115907:
        uVar9 = (uint)bVar2;
        bVar8 = uVar9 == 0x5c || uVar9 == 0x22;
        iVar5 = isprint(uVar9);
        __return_storage_ptr__ = local_90;
        if (((iVar5 != 0) || (bVar2 == 0x5c)) || (bVar2 == 0x22)) goto LAB_00115928;
        if (bVar3) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (local_90,"\"");
          bVar3 = false;
        }
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,",");
        }
        stringformat<unsigned_char_const&>(&local_b8,"%02x",args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_b8._M_dataplus._M_p,local_b8._M_string_length);
LAB_00115a78:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        pvVar7 = memchr(local_78,(int)(char)bVar2,local_70);
        bVar8 = true;
        if (pvVar7 == (void *)0x0 || (long)pvVar7 - (long)plVar4 == -1) goto LAB_00115907;
LAB_00115928:
        __return_storage_ptr__ = local_90;
        if (!bVar3) {
          if (local_90->_M_string_length != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (local_90,",");
          }
          bVar3 = true;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"\"");
        }
        if (bVar8) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          bVar2 = *args;
          if (bVar2 < 0xd) {
            if (bVar2 == 9) {
              __s = "\\t";
              goto LAB_00115a55;
            }
            if (bVar2 == 10) {
              __s = "\\n";
              goto LAB_00115a55;
            }
LAB_00115af6:
            stringformat<unsigned_char_const&>(&local_50,"\\x%02x",args);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_b8,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            __s = "\\r";
            if (bVar2 != 0xd) {
              if (bVar2 == 0x22) {
                __s = "\\\"";
              }
              else {
                if (bVar2 != 0x5c) goto LAB_00115af6;
                __s = "\\\\";
              }
            }
LAB_00115a55:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&local_b8,0,0,__s,2);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          goto LAB_00115a78;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,*args);
      }
      usedlen = local_58;
      uVar1 = uVar6 + 1;
      uVar9 = uVar10;
      if (uVar1 < local_88) {
        if (uVar6 == 0) {
          if (*args < 0xe) {
            uVar10 = 0x2401 >> (*args & 0x1f);
          }
          else {
            uVar10 = 0;
          }
        }
        if ((0xd < local_80[uVar6 + 1]) ||
           (uVar9 = 1, (0x2401U >> (local_80[uVar6 + 1] & 0x1f) & 1) == 0)) {
          if ((uVar10 & 1) != 0) {
            sVar11 = uVar6 + 1;
            break;
          }
          uVar9 = 0;
        }
      }
      uVar10 = uVar9;
      uVar6 = uVar1;
      sVar11 = local_88;
    } while (local_88 != uVar1);
    if (bVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
  }
  *usedlen = sVar11;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dumpstrings(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string result;
    bool bQuoted= false;
    bool bThisIsEolChar= false;
    std::string escaped= "\n\r\t";

    size_t i;
    for (i=0 ; i<len ; i++)
    {
        bool bNeedsEscape= escaped.find((char)buf[i])!=escaped.npos 
            || buf[i]=='\"' 
            || buf[i]=='\\';

        if (isprint(buf[i]) || bNeedsEscape) {
            if (!bQuoted) {
                if (!result.empty())
                    result += ",";
                result += "\"";
                bQuoted= true;
            }
            if (bNeedsEscape) {
                std::string escapecode;
                switch(buf[i]) {
                    case '\n': escapecode= "\\n"; break;
                    case '\r': escapecode= "\\r"; break;
                    case '\t': escapecode= "\\t"; break;
                    case '\"': escapecode= "\\\""; break;
                    case '\\': escapecode= "\\\\"; break;
                    default:
                       escapecode= stringformat("\\x%02x", buf[i]);
                }
                result += escapecode;
            }
            else {
                result += (char) buf[i];
            }
        }
        else {
            if (bQuoted) {
                result += "\"";
                bQuoted= false;
            }
            if (!result.empty())
                result += ",";
            result += stringformat("%02x", buf[i]);
        }
        if (i+1<len) {
            if (i==0)
                bThisIsEolChar = (buf[i]==0x0a || buf[i]==0x0d || buf[i]==0);

            bool bNextIsEolChar= (buf[i+1]==0x0a || buf[i+1]==0x0d || buf[i+1]==0);
            if (bThisIsEolChar && !bNextIsEolChar) {
                i++;
                break;
            }
            bThisIsEolChar= bNextIsEolChar;
        }
    }

    if (bQuoted) {
        result += "\"";
        bQuoted= false;
    }

    usedlen= i;

    return result;
}